

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_add_custom_headers(Curl_easy *data,_Bool is_connect,dynbuf *req)

{
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  CURLcode CVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  undefined7 in_register_00000031;
  curl_slist *pcVar9;
  char cVar10;
  curl_slist *h [2];
  CURLcode local_6c;
  long local_68;
  curl_slist *local_58 [2];
  connectdata *local_48;
  dynbuf *local_40;
  long local_38;
  
  local_40 = req;
  local_48 = data->conn;
  cVar10 = '\x02';
  if ((int)CONCAT71(in_register_00000031,is_connect) == 0) {
    cVar10 = ((ulong)data->conn->bits & 9) == 1;
  }
  if (cVar10 == '\x02') {
    if (((data->set).field_0x8ca & 8) == 0) goto LAB_00134b7a;
    local_58[0] = (data->set).proxyheaders;
  }
  else {
    if (cVar10 == '\x01') {
      local_58[0] = (data->set).headers;
      local_68 = 1;
      if (((data->set).field_0x8ca & 8) != 0) {
        local_58[1] = (data->set).proxyheaders;
        local_68 = 2;
      }
      goto LAB_00134b99;
    }
LAB_00134b7a:
    local_58[0] = (data->set).headers;
  }
  local_68 = 1;
LAB_00134b99:
  local_38 = 0;
  do {
    pcVar9 = local_58[local_38];
LAB_00134baa:
    if (pcVar9 != (curl_slist *)0x0) {
      pcVar7 = pcVar9->data;
      pcVar5 = strchr(pcVar7,0x3a);
      if (pcVar5 == (char *)0x0) {
        pcVar6 = strchr(pcVar7,0x3b);
        bVar1 = true;
        pcVar8 = pcVar6;
        pcVar5 = pcVar6;
        if (pcVar6 != (char *)0x0) {
          do {
            cVar10 = pcVar5[1];
            if ((cVar10 != '\t') && (cVar10 != ' ')) {
              if (cVar10 == '\0') goto LAB_00134c1d;
              if (3 < (byte)(cVar10 - 10U)) goto LAB_00134c15;
            }
            pcVar8 = pcVar8 + 1;
            pcVar5 = pcVar5 + 1;
          } while( true );
        }
        pcVar7 = (char *)0x0;
        pcVar5 = (char *)0x0;
        goto LAB_00134c57;
      }
      pcVar7 = (char *)0x0;
      goto LAB_00134c5f;
    }
    local_38 = local_38 + 1;
    if (local_38 == local_68) {
      return CURLE_OK;
    }
  } while( true );
LAB_00134c15:
  if (cVar10 == '\0') {
LAB_00134c1d:
    if (*pcVar5 != ';') goto LAB_00134c4f;
    pcVar7 = (*Curl_cstrdup)(pcVar7);
    if (pcVar7 == (char *)0x0) {
      Curl_dyn_free(local_40);
      local_6c = CURLE_OUT_OF_MEMORY;
      pcVar7 = (char *)0x0;
      bVar1 = false;
    }
    else {
      pcVar8[(long)pcVar7 - (long)pcVar9->data] = ':';
      pcVar5 = pcVar8 + ((long)pcVar7 - (long)pcVar9->data);
    }
  }
  else {
    pcVar6 = (char *)0x0;
LAB_00134c4f:
    pcVar7 = (char *)0x0;
    pcVar5 = pcVar6;
  }
LAB_00134c57:
  CVar4 = local_6c;
  if (bVar1) {
LAB_00134c5f:
    if ((pcVar5 != (char *)0x0) && (pcVar5 != pcVar9->data)) {
      do {
        do {
          pcVar5 = pcVar5 + 1;
          cVar10 = *pcVar5;
        } while (cVar10 == '\t');
      } while ((cVar10 == ' ') || ((cVar10 != '\0' && ((byte)(cVar10 - 10U) < 4))));
      if ((pcVar7 != (char *)0x0) || (cVar10 != '\0')) {
        pcVar5 = pcVar9->data;
        if (pcVar7 != (char *)0x0) {
          pcVar5 = pcVar7;
        }
        if ((((((data->state).aptr.host == (char *)0x0) ||
              (iVar3 = curl_strnequal(pcVar5,"Host:",5), iVar3 == 0)) &&
             (((data->state).httpreq != '\x02' ||
              (iVar3 = curl_strnequal(pcVar5,"Content-Type:",0xd), iVar3 == 0)))) &&
            (((data->state).httpreq != '\x03' ||
             (iVar3 = curl_strnequal(pcVar5,"Content-Type:",0xd), iVar3 == 0)))) &&
           (((((data->req).field_0xdb & 4) == 0 ||
             (iVar3 = curl_strnequal(pcVar5,"Content-Length:",0xf), iVar3 == 0)) &&
            (((((data->state).aptr.te == (char *)0x0 ||
               (iVar3 = curl_strnequal(pcVar5,"Connection:",0xb), iVar3 == 0)) &&
              ((local_48->httpversion < 0x14 ||
               (iVar3 = curl_strnequal(pcVar5,"Transfer-Encoding:",0x12), iVar3 == 0)))) &&
             (((iVar3 = curl_strnequal(pcVar5,"Authorization:",0xe), iVar3 == 0 &&
               (iVar3 = curl_strnequal(pcVar5,"Cookie:",7), iVar3 == 0)) ||
              (_Var2 = Curl_auth_allowed_to_host(data), _Var2)))))))) {
          CVar4 = Curl_dyn_addf(local_40,"%s\r\n",pcVar5);
        }
        else {
          CVar4 = CURLE_OK;
        }
        if (pcVar7 != (char *)0x0) {
          (*Curl_cfree)(pcVar7);
        }
        if (CVar4 != CURLE_OK) goto LAB_00134e01;
      }
    }
    pcVar9 = pcVar9->next;
    bVar1 = true;
  }
  else {
LAB_00134e01:
    local_6c = CVar4;
    bVar1 = false;
  }
  if (!bVar1) {
    return local_6c;
  }
  goto LAB_00134baa;
}

Assistant:

CURLcode Curl_add_custom_headers(struct Curl_easy *data,
                                 bool is_connect,
#ifndef USE_HYPER
                                 struct dynbuf *req
#else
                                 void *req
#endif
  )
{
  struct connectdata *conn = data->conn;
  char *ptr;
  struct curl_slist *h[2];
  struct curl_slist *headers;
  int numlists = 1; /* by default */
  int i;

#ifndef CURL_DISABLE_PROXY
  enum proxy_use proxy;

  if(is_connect)
    proxy = HEADER_CONNECT;
  else
    proxy = conn->bits.httpproxy && !conn->bits.tunnel_proxy ?
      HEADER_PROXY : HEADER_SERVER;

  switch(proxy) {
  case HEADER_SERVER:
    h[0] = data->set.headers;
    break;
  case HEADER_PROXY:
    h[0] = data->set.headers;
    if(data->set.sep_headers) {
      h[1] = data->set.proxyheaders;
      numlists++;
    }
    break;
  case HEADER_CONNECT:
    if(data->set.sep_headers)
      h[0] = data->set.proxyheaders;
    else
      h[0] = data->set.headers;
    break;
  }
#else
  (void)is_connect;
  h[0] = data->set.headers;
#endif

  /* loop through one or two lists */
  for(i = 0; i < numlists; i++) {
    headers = h[i];

    while(headers) {
      char *semicolonp = NULL;
      ptr = strchr(headers->data, ':');
      if(!ptr) {
        char *optr;
        /* no colon, semicolon? */
        ptr = strchr(headers->data, ';');
        if(ptr) {
          optr = ptr;
          ptr++; /* pass the semicolon */
          while(*ptr && ISSPACE(*ptr))
            ptr++;

          if(*ptr) {
            /* this may be used for something else in the future */
            optr = NULL;
          }
          else {
            if(*(--ptr) == ';') {
              /* copy the source */
              semicolonp = strdup(headers->data);
              if(!semicolonp) {
#ifndef USE_HYPER
                Curl_dyn_free(req);
#endif
                return CURLE_OUT_OF_MEMORY;
              }
              /* put a colon where the semicolon is */
              semicolonp[ptr - headers->data] = ':';
              /* point at the colon */
              optr = &semicolonp [ptr - headers->data];
            }
          }
          ptr = optr;
        }
      }
      if(ptr && (ptr != headers->data)) {
        /* we require a colon for this to be a true header */

        ptr++; /* pass the colon */
        while(*ptr && ISSPACE(*ptr))
          ptr++;

        if(*ptr || semicolonp) {
          /* only send this if the contents was non-blank or done special */
          CURLcode result = CURLE_OK;
          char *compare = semicolonp ? semicolonp : headers->data;

          if(data->state.aptr.host &&
             /* a Host: header was sent already, do not pass on any custom
                Host: header as that will produce *two* in the same
                request! */
             checkprefix("Host:", compare))
            ;
          else if(data->state.httpreq == HTTPREQ_POST_FORM &&
                  /* this header (extended by formdata.c) is sent later */
                  checkprefix("Content-Type:", compare))
            ;
          else if(data->state.httpreq == HTTPREQ_POST_MIME &&
                  /* this header is sent later */
                  checkprefix("Content-Type:", compare))
            ;
          else if(data->req.authneg &&
                  /* while doing auth neg, do not allow the custom length since
                     we will force length zero then */
                  checkprefix("Content-Length:", compare))
            ;
          else if(data->state.aptr.te &&
                  /* when asking for Transfer-Encoding, do not pass on a custom
                     Connection: */
                  checkprefix("Connection:", compare))
            ;
          else if((conn->httpversion >= 20) &&
                  checkprefix("Transfer-Encoding:", compare))
            /* HTTP/2 does not support chunked requests */
            ;
          else if((checkprefix("Authorization:", compare) ||
                   checkprefix("Cookie:", compare)) &&
                  /* be careful of sending this potentially sensitive header to
                     other hosts */
                  !Curl_auth_allowed_to_host(data))
            ;
          else {
#ifdef USE_HYPER
            result = Curl_hyper_header(data, req, compare);
#else
            result = Curl_dyn_addf(req, "%s\r\n", compare);
#endif
          }
          if(semicolonp)
            free(semicolonp);
          if(result)
            return result;
        }
      }
      headers = headers->next;
    }
  }

  return CURLE_OK;
}